

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

FILE * open_fifo(void)

{
  int iVar1;
  FILE *pFVar2;
  
  iVar1 = mkfifo("/tmp/ipc_bench_fifo",0x1b6);
  if (0 < iVar1) {
    throw("Error creating FIFO");
  }
  notify_client();
  pFVar2 = fopen("/tmp/ipc_bench_fifo","w");
  if (pFVar2 != (FILE *)0x0) {
    return (FILE *)pFVar2;
  }
  throw("Error opening descriptor to FIFO on server side");
}

Assistant:

FILE* open_fifo() {
	FILE* stream;

	// Just in case it already exists
	//(void)remove(FIFO_PATH);

	// Create a FIFO object. Note that a FIFO is
	// really just a special file, which must be
	// opened by one process and to which then
	// both server and client can write using standard
	// c i/o functions. 0666 specifies read+write
	// access permissions for the user, group and world
	if (mkfifo(FIFO_PATH, 0666) > 0) {
		throw("Error creating FIFO");
	}

	// Tell the client the fifo now exists and
	// can be opened from the read end
	notify_client();

	// Because a fifo is really just a file, we can
	// open a normal FILE* stream to it (in write mode)
	// Note that this call will block until the read-end
	// is opened by the client
	if ((stream = fopen(FIFO_PATH, "w")) == NULL) {
		throw("Error opening descriptor to FIFO on server side");
	}

	return stream;
}